

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_typeof(lua_State *L)

{
  CTState *cts_00;
  CTypeID CVar1;
  void *pvVar2;
  GCcdata *cd;
  CTypeID id;
  CTState *cts;
  lua_State *L_local;
  CTState *cts_1;
  GCcdata *cd_1;
  
  cts_00 = *(CTState **)((L->glref).ptr64 + 0x180);
  cts_00->L = L;
  CVar1 = ffi_checkctype(L,cts_00,L->base + 1);
  pvVar2 = lj_mem_newgco(cts_00->L,0x14);
  *(undefined1 *)((long)pvVar2 + 9) = 10;
  *(undefined2 *)((long)pvVar2 + 10) = 0x16;
  *(CTypeID *)((long)pvVar2 + 0x10) = CVar1;
  L->top[-1].u64 = (ulong)pvVar2 | 0xfffa800000000000;
  if (*(ulong *)((L->glref).ptr64 + 0x18) <= *(ulong *)((L->glref).ptr64 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_typeof)	LJLIB_REC(.)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = ffi_checkctype(L, cts, L->base+1);
  GCcdata *cd = lj_cdata_new(cts, CTID_CTYPEID, 4);
  *(CTypeID *)cdataptr(cd) = id;
  setcdataV(L, L->top-1, cd);
  lj_gc_check(L);
  return 1;
}